

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3AlterRenameColumn(Parse *pParse,SrcList *pSrc,Token *pOld,Token *pNew)

{
  byte bVar1;
  short sVar2;
  sqlite3 *db;
  Schema *pSVar3;
  char *zArg1;
  int iVar4;
  int iVar5;
  Table *pTab;
  char *p;
  Parse *pPVar6;
  char *p_00;
  Schema **ppSVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  
  db = pParse->db;
  pTab = sqlite3LocateTableItem(pParse,0,pSrc->a);
  if (((pTab != (Table *)0x0) && (iVar4 = isAlterableTable(pParse,pTab), iVar4 == 0)) &&
     (iVar4 = isRealTable(pParse,pTab,0), iVar4 == 0)) {
    if (pTab->pSchema == (Schema *)0x0) {
      iVar4 = -0x8000;
    }
    else {
      iVar4 = -1;
      ppSVar7 = &db->aDb->pSchema;
      do {
        iVar4 = iVar4 + 1;
        pSVar3 = *ppSVar7;
        ppSVar7 = ppSVar7 + 4;
      } while (pSVar3 != pTab->pSchema);
    }
    zArg1 = db->aDb[iVar4].zDbSName;
    iVar5 = sqlite3AuthCheck(pParse,0x1a,zArg1,pTab->zName,(char *)0x0);
    if ((iVar5 == 0) && (p = sqlite3NameFromToken(db,pOld), p != (char *)0x0)) {
      sVar2 = pTab->nCol;
      if (sVar2 < 1) {
        uVar8 = 0;
LAB_00165f6a:
        if ((uint)uVar8 == (int)sVar2) {
LAB_00165f6f:
          p_00 = (char *)0x0;
          sqlite3ErrorMsg(pParse,"no such column: \"%T\"",pOld);
        }
        else {
          bVar10 = iVar4 == 1;
          renameTestSchema(pParse,zArg1,(uint)bVar10,"",0);
          renameFixQuotes(pParse,zArg1,(uint)bVar10);
          pPVar6 = pParse->pToplevel;
          if (pParse->pToplevel == (Parse *)0x0) {
            pPVar6 = pParse;
          }
          pPVar6->mayAbort = '\x01';
          p_00 = sqlite3NameFromToken(db,pNew);
          if (p_00 == (char *)0x0) {
            p_00 = (char *)0x0;
          }
          else {
            bVar1 = ""[(byte)*pNew->z];
            sqlite3NestedParse(pParse,
                               "UPDATE \"%w\".sqlite_master SET sql = sqlite_rename_column(sql, type, name, %Q, %Q, %d, %Q, %d, %d) WHERE name NOT LIKE \'sqliteX_%%\' ESCAPE \'X\'  AND (type != \'index\' OR tbl_name = %Q)"
                               ,zArg1,zArg1,pTab->zName,uVar8,p_00,(ulong)(bVar1 & 0xffffff80),
                               (ulong)bVar10,pTab->zName);
            sqlite3NestedParse(pParse,
                               "UPDATE temp.sqlite_master SET sql = sqlite_rename_column(sql, type, name, %Q, %Q, %d, %Q, %d, 1) WHERE type IN (\'trigger\', \'view\')"
                               ,zArg1,pTab->zName,uVar8,p_00,(ulong)(bVar1 & 0xffffff80));
            renameReloadSchema(pParse,iVar4,1);
            renameTestSchema(pParse,zArg1,(uint)bVar10,"after rename",1);
          }
        }
        sqlite3SrcListDelete(db,pSrc);
        sqlite3DbFreeNN(db,p);
        if (p_00 == (char *)0x0) {
          return;
        }
        sqlite3DbFreeNN(db,p_00);
        return;
      }
      uVar8 = 0;
LAB_00165f26:
      lVar9 = 0;
      do {
        bVar1 = pTab->aCol[uVar8].zCnName[lVar9];
        if (bVar1 == p[lVar9]) {
          if ((ulong)bVar1 == 0) goto LAB_00165f6a;
        }
        else if (""[bVar1] != ""[(byte)p[lVar9]]) goto LAB_00165f59;
        lVar9 = lVar9 + 1;
      } while( true );
    }
  }
  sqlite3SrcListDelete(db,pSrc);
  return;
LAB_00165f59:
  uVar8 = uVar8 + 1;
  if (uVar8 == (uint)(int)sVar2) goto LAB_00165f6f;
  goto LAB_00165f26;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterRenameColumn(
  Parse *pParse,                  /* Parsing context */
  SrcList *pSrc,                  /* Table being altered.  pSrc->nSrc==1 */
  Token *pOld,                    /* Name of column being changed */
  Token *pNew                     /* New column name */
){
  sqlite3 *db = pParse->db;       /* Database connection */
  Table *pTab;                    /* Table being updated */
  int iCol;                       /* Index of column being renamed */
  char *zOld = 0;                 /* Old column name */
  char *zNew = 0;                 /* New column name */
  const char *zDb;                /* Name of schema containing the table */
  int iSchema;                    /* Index of the schema */
  int bQuote;                     /* True to quote the new name */

  /* Locate the table to be altered */
  pTab = sqlite3LocateTableItem(pParse, 0, &pSrc->a[0]);
  if( !pTab ) goto exit_rename_column;

  /* Cannot alter a system table */
  if( SQLITE_OK!=isAlterableTable(pParse, pTab) ) goto exit_rename_column;
  if( SQLITE_OK!=isRealTable(pParse, pTab, 0) ) goto exit_rename_column;

  /* Which schema holds the table to be altered */
  iSchema = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iSchema>=0 );
  zDb = db->aDb[iSchema].zDbSName;

#ifndef SQLITE_OMIT_AUTHORIZATION
  /* Invoke the authorization callback. */
  if( sqlite3AuthCheck(pParse, SQLITE_ALTER_TABLE, zDb, pTab->zName, 0) ){
    goto exit_rename_column;
  }
#endif

  /* Make sure the old name really is a column name in the table to be
  ** altered.  Set iCol to be the index of the column being renamed */
  zOld = sqlite3NameFromToken(db, pOld);
  if( !zOld ) goto exit_rename_column;
  for(iCol=0; iCol<pTab->nCol; iCol++){
    if( 0==sqlite3StrICmp(pTab->aCol[iCol].zCnName, zOld) ) break;
  }
  if( iCol==pTab->nCol ){
    sqlite3ErrorMsg(pParse, "no such column: \"%T\"", pOld);
    goto exit_rename_column;
  }

  /* Ensure the schema contains no double-quoted strings */
  renameTestSchema(pParse, zDb, iSchema==1, "", 0);
  renameFixQuotes(pParse, zDb, iSchema==1);

  /* Do the rename operation using a recursive UPDATE statement that
  ** uses the sqlite_rename_column() SQL function to compute the new
  ** CREATE statement text for the sqlite_schema table.
  */
  sqlite3MayAbort(pParse);
  zNew = sqlite3NameFromToken(db, pNew);
  if( !zNew ) goto exit_rename_column;
  assert( pNew->n>0 );
  bQuote = sqlite3Isquote(pNew->z[0]);
  sqlite3NestedParse(pParse,
      "UPDATE \"%w\"." LEGACY_SCHEMA_TABLE " SET "
      "sql = sqlite_rename_column(sql, type, name, %Q, %Q, %d, %Q, %d, %d) "
      "WHERE name NOT LIKE 'sqliteX_%%' ESCAPE 'X' "
      " AND (type != 'index' OR tbl_name = %Q)",
      zDb,
      zDb, pTab->zName, iCol, zNew, bQuote, iSchema==1,
      pTab->zName
  );

  sqlite3NestedParse(pParse,
      "UPDATE temp." LEGACY_SCHEMA_TABLE " SET "
      "sql = sqlite_rename_column(sql, type, name, %Q, %Q, %d, %Q, %d, 1) "
      "WHERE type IN ('trigger', 'view')",
      zDb, pTab->zName, iCol, zNew, bQuote
  );

  /* Drop and reload the database schema. */
  renameReloadSchema(pParse, iSchema, INITFLAG_AlterRename);
  renameTestSchema(pParse, zDb, iSchema==1, "after rename", 1);

 exit_rename_column:
  sqlite3SrcListDelete(db, pSrc);
  sqlite3DbFree(db, zOld);
  sqlite3DbFree(db, zNew);
  return;
}